

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  int iVar1;
  Table *pTVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  Column *pCVar10;
  bool bVar11;
  uint local_70;
  char *local_68;
  char *zErrMsg;
  int local_4c;
  char *local_48;
  char **local_40;
  char **local_38;
  
  zErrMsg = (char *)0x0;
  local_48 = zTableName;
  local_40 = pzDataType;
  local_38 = pzCollSeq;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  local_4c = sqlite3Init(db,&zErrMsg);
  if (local_4c == 0) {
    pTVar2 = sqlite3FindTable(db,local_48,zDbName);
    if ((pTVar2 != (Table *)0x0) && (pTVar2->eTabType != '\x02')) {
      uVar3 = 1;
      local_68 = "INTEGER";
      if (zColumnName == (char *)0x0) {
        pcVar4 = (char *)0x0;
        bVar11 = false;
        local_70 = 0;
      }
      else {
        uVar3 = (uint)pTVar2->nCol;
        lVar8 = 0;
        uVar6 = 0;
        if (0 < (int)uVar3) {
          uVar6 = (ulong)uVar3;
        }
        pCVar10 = (Column *)0x0;
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          pCVar10 = pTVar2->aCol;
          iVar1 = sqlite3StrICmp(*(char **)((long)&pCVar10->zCnName + lVar8),zColumnName);
          if (iVar1 == 0) {
            pCVar10 = (Column *)((long)&pCVar10->zCnName + lVar8);
            uVar6 = uVar9 & 0xffffffff;
            break;
          }
          pCVar10 = (Column *)((long)&pCVar10->zCnName + lVar8);
          lVar8 = lVar8 + 0x10;
        }
        uVar5 = (uint)uVar6;
        if (uVar5 == uVar3) {
          if ((pTVar2->tabFlags & 0x80) == 0) {
            iVar1 = sqlite3IsRowid(zColumnName);
            if (iVar1 != 0) {
              uVar5 = (uint)pTVar2->iPKey;
              if (-1 < (int)uVar5) {
                pCVar10 = pTVar2->aCol + (ushort)pTVar2->iPKey;
                goto LAB_00122054;
              }
              goto LAB_001220a3;
            }
          }
          goto LAB_00121e73;
        }
LAB_00122054:
        if (pCVar10 == (Column *)0x0) {
LAB_001220a3:
          pcVar4 = (char *)0x0;
          bVar11 = false;
          local_70 = 0;
          uVar3 = 1;
        }
        else {
          local_70 = 0;
          local_68 = sqlite3ColumnType(pCVar10,(char *)0x0);
          pcVar4 = sqlite3ColumnColl(pCVar10);
          bVar11 = (pCVar10->field_0x8 & 0xf) != 0;
          uVar3 = pCVar10->colFlags & 1;
          if (uVar5 == (int)pTVar2->iPKey) {
            local_70 = pTVar2->tabFlags >> 3 & 1;
          }
        }
      }
      uVar5 = (uint)bVar11;
      pcVar7 = "BINARY";
      if (pcVar4 != (char *)0x0) {
        pcVar7 = pcVar4;
      }
      bVar11 = true;
      goto LAB_00121e91;
    }
  }
LAB_00121e73:
  bVar11 = false;
  local_68 = (char *)0x0;
  pcVar7 = (char *)0x0;
  uVar5 = 0;
  uVar3 = 0;
  local_70 = 0;
LAB_00121e91:
  sqlite3BtreeLeaveAll(db);
  if (local_40 != (char **)0x0) {
    *local_40 = local_68;
  }
  if (local_38 != (char **)0x0) {
    *local_38 = pcVar7;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar5;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar3;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = local_70;
  }
  iVar1 = local_4c;
  if (local_4c == 0 && !bVar11) {
    sqlite3DbFree(db,zErrMsg);
    zErrMsg = sqlite3MPrintf(db,"no such table column: %s.%s",local_48,zColumnName);
    iVar1 = 1;
  }
  pcVar4 = "%s";
  if (zErrMsg == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,iVar1,pcVar4);
  sqlite3DbFree(db,zErrMsg);
  iVar1 = sqlite3ApiExit(db,iVar1);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || IsView(pTab) ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zCnName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  **
  **     1. The specified column name was rowid", "oid" or "_rowid_"
  **        and there is no explicitly declared IPK column.
  **
  **     2. The table is not a view and the column name identified an
  **        explicitly declared column. Copy meta information from *pCol.
  */
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = sqlite3ColumnColl(pCol);
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}